

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::GetObjectLibrariesCMP0026
          (cmTarget *this,vector<cmTarget_*,_std::allocator<cmTarget_*>_> *objlibs)

{
  char cVar1;
  bool bVar2;
  cmTargetInternals *pcVar3;
  size_type sVar4;
  pointer ppTVar5;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmTarget *objLib;
  string entry;
  string objLibName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar3 = (this->Internal).Pointer;
  ppTVar5 = (pcVar3->SourceEntries).
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppTVar5 ==
        (pcVar3->SourceEntries).
        super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    std::__cxx11::string::string((string *)&entry,(string *)&(((*ppTVar5)->ge).x_)->Input);
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(&entry,&files,false);
    for (pbVar6 = files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 != files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
      std::__cxx11::string::string((string *)&local_50,(string *)pbVar6);
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                        (&local_50,(char (*) [18])"$<TARGET_OBJECTS:");
      this_00 = &local_50;
      if (bVar2) {
        cVar1 = (pbVar6->_M_dataplus)._M_p[pbVar6->_M_string_length - 1];
        std::__cxx11::string::~string((string *)&local_50);
        if (cVar1 == '>') {
          std::__cxx11::string::substr((ulong)&objLibName,(ulong)pbVar6);
          sVar4 = cmGeneratorExpression::Find(&objLibName);
          this_00 = &objLibName;
          if ((sVar4 == 0xffffffffffffffff) &&
             (objLib = cmMakefile::FindTargetToUse(this->Makefile,&objLibName,false),
             objLib != (cmTarget *)0x0)) {
            std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::push_back(objlibs,&objLib);
          }
          goto LAB_0038bf6d;
        }
      }
      else {
LAB_0038bf6d:
        std::__cxx11::string::~string((string *)this_00);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files);
    std::__cxx11::string::~string((string *)&entry);
    ppTVar5 = ppTVar5 + 1;
    pcVar3 = (this->Internal).Pointer;
  } while( true );
}

Assistant:

void
cmTarget::GetObjectLibrariesCMP0026(std::vector<cmTarget*>& objlibs) const
{
  // At configure-time, this method can be called as part of getting the
  // LOCATION property or to export() a file to be include()d.  However
  // there is no cmGeneratorTarget at configure-time, so search the SOURCES
  // for TARGET_OBJECTS instead for backwards compatibility with OLD
  // behavior of CMP0024 and CMP0026 only.
  typedef cmTargetInternals::TargetPropertyEntry
                              TargetPropertyEntry;
  for(std::vector<TargetPropertyEntry*>::const_iterator
        i = this->Internal->SourceEntries.begin();
      i != this->Internal->SourceEntries.end(); ++i)
    {
    std::string entry = (*i)->ge->GetInput();

    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::vector<std::string>::const_iterator
        li = files.begin(); li != files.end(); ++li)
      {
      if(cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
          (*li)[li->size() - 1] == '>')
        {
        std::string objLibName = li->substr(17, li->size()-18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos)
          {
          continue;
          }
        cmTarget *objLib = this->Makefile->FindTargetToUse(objLibName);
        if(objLib)
          {
          objlibs.push_back(objLib);
          }
        }
      }
    }
}